

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Journal.cc
# Opt level: O0

void __thiscall JournalOperation::status(JournalOperation *this)

{
  ostream *poVar1;
  char *pcVar2;
  void *this_00;
  string *in_RDI;
  
  poVar1 = sdglib::OutputLog(this._7_1_);
  poVar1 = std::operator<<(poVar1,"Operation: ");
  poVar1 = std::operator<<(poVar1,in_RDI);
  poVar1 = std::operator<<(poVar1," applied on ");
  pcVar2 = ctime((time_t *)(in_RDI + 0x20));
  std::operator<<(poVar1,pcVar2);
  poVar1 = sdglib::OutputLog(this._7_1_);
  poVar1 = std::operator<<(poVar1,"Tool: ");
  poVar1 = std::operator<<(poVar1,in_RDI + 0x28);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = sdglib::OutputLog(this._7_1_);
  poVar1 = std::operator<<(poVar1,"Details: ");
  poVar1 = std::operator<<(poVar1,in_RDI + 0x48);
  this_00 = (void *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void JournalOperation::status() const {
    sdglib::OutputLog(false) << "Operation: " << name << " applied on " << ctime(&timestamp);
    sdglib::OutputLog(false) << "Tool: " << tool << std::endl;
    sdglib::OutputLog(false) << "Details: " << detail << std::endl << std::endl;
}